

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# microui.c
# Opt level: O3

void mu_begin_panel_ex(mu_Context *ctx,char *name,int opt)

{
  int iVar1;
  size_t sVar2;
  mu_Container *cnt;
  mu_Context *ctx_00;
  mu_Rect mVar3;
  
  sVar2 = strlen(name);
  mu_push_id(ctx,name,(int)sVar2);
  cnt = get_container(ctx,ctx->last_id,opt);
  ctx_00 = ctx;
  mVar3 = mu_layout_next(ctx);
  cnt->rect = mVar3;
  if ((opt & 8U) == 0) {
    ctx_00 = ctx;
    (*ctx->draw_frame)(ctx,mVar3,5);
  }
  iVar1 = (ctx->container_stack).idx;
  if ((long)iVar1 < 0x20) {
    (ctx->container_stack).items[iVar1] = cnt;
    (ctx->container_stack).idx = iVar1 + 1;
    push_container_body(ctx,cnt,cnt->rect,opt);
    mu_push_clip_rect(ctx,cnt->body);
    return;
  }
  mu_begin_panel_ex_cold_1();
  mu_pop_clip_rect(ctx_00);
  pop_container(ctx_00);
  return;
}

Assistant:

void mu_begin_panel_ex(mu_Context *ctx, const char *name, int opt) {
  mu_Container *cnt;
  mu_push_id(ctx, name, strlen(name));
  cnt = get_container(ctx, ctx->last_id, opt);
  cnt->rect = mu_layout_next(ctx);
  if (~opt & MU_OPT_NOFRAME) {
    ctx->draw_frame(ctx, cnt->rect, MU_COLOR_PANELBG);
  }
  push(ctx->container_stack, cnt);
  push_container_body(ctx, cnt, cnt->rect, opt);
  mu_push_clip_rect(ctx, cnt->body);
}